

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsAnyMessage(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  Options *options_00;
  
  options_00 = (Options *)&(anonymous_namespace)::kAnyMessageName;
  bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           descriptor,"Any");
  if (bVar1) {
    bVar1 = IsAnyMessage(*(FileDescriptor **)(descriptor + 0x10),options_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool IsAnyMessage(const Descriptor* descriptor, const Options& options) {
  return descriptor->name() == kAnyMessageName &&
         IsAnyMessage(descriptor->file(), options);
}